

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,ArrayElementRef *s)

{
  Expression *pEVar1;
  ArrayElementRef *s_local;
  ASTVisitor *this_local;
  
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&s->object);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  pEVar1 = pool_ptr<soul::AST::Expression>::operator*(&s->startIndex);
  (*this->_vptr_ASTVisitor[3])(this,pEVar1);
  visitObjectIfNotNull<soul::pool_ptr<soul::AST::Expression>>(this,&s->endIndex);
  return;
}

Assistant:

virtual void visit (AST::ArrayElementRef& s)
    {
        visitObject (*s.object);
        visitObject (*s.startIndex);
        visitObjectIfNotNull (s.endIndex);
    }